

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestFactoryBase *factory)

{
  TestInfo *pTVar1;
  string *in_RCX;
  string *in_RDX;
  TestInfo *in_RSI;
  char *in_RDI;
  char *in_R8;
  char *in_R9;
  TestFactoryBase *unaff_retaddr;
  TestInfo *test_info;
  allocator local_91;
  string local_90 [40];
  TestInfo *in_stack_ffffffffffffff98;
  TearDownTestCaseFunc in_stack_ffffffffffffffa0;
  SetUpTestCaseFunc in_stack_ffffffffffffffa8;
  UnitTestImpl *in_stack_ffffffffffffffb0;
  TypeId in_stack_ffffffffffffffc8;
  TestInfo *this;
  
  pTVar1 = (TestInfo *)operator_new(0xe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa8,in_RDI,(allocator *)&stack0xffffffffffffffa7);
  this = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(char *)in_RSI,&local_91);
  TestInfo::TestInfo(this,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,unaff_retaddr);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  GetUnitTestImpl();
  UnitTestImpl::AddTestInfo
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  return pTVar1;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}